

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_kd_tree_decoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudKdTreeDecoder::DecodeGeometryData(PointCloudKdTreeDecoder *this)

{
  bool bVar1;
  PointCloud *this_00;
  PointCloudDecoder *in_RDI;
  int32_t num_points;
  undefined4 in_stack_ffffffffffffffe8;
  ValueType in_stack_ffffffffffffffec;
  undefined1 local_1;
  
  PointCloudDecoder::buffer(in_RDI);
  bVar1 = DecoderBuffer::Decode<int>
                    ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (int *)in_RDI);
  if (bVar1) {
    if ((int)in_stack_ffffffffffffffec < 0) {
      local_1 = false;
    }
    else {
      this_00 = PointCloudDecoder::point_cloud(in_RDI);
      PointCloud::set_num_points(this_00,in_stack_ffffffffffffffec);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PointCloudKdTreeDecoder::DecodeGeometryData() {
  int32_t num_points;
  if (!buffer()->Decode(&num_points)) {
    return false;
  }
  if (num_points < 0) {
    return false;
  }
  point_cloud()->set_num_points(num_points);
  return true;
}